

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# particle_filter.cpp
# Opt level: O1

void __thiscall
ParticleFilter::updateWeights
          (ParticleFilter *this,double sensor_range,double *std_landmark,
          vector<LandmarkObs,_std::allocator<LandmarkObs>_> *observations,Map *map_landmarks)

{
  pointer pPVar1;
  pointer psVar2;
  pointer pLVar3;
  pointer psVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  pointer psVar9;
  uint uVar10;
  ulong uVar11;
  bool bVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  vector<LandmarkObs,_std::allocator<LandmarkObs>_> meas_map;
  LandmarkObs cur_meas_map;
  LandmarkObs *local_98;
  iterator iStack_90;
  LandmarkObs *local_88;
  ParticleFilter *local_78;
  pointer local_70;
  ulong local_68;
  double local_60;
  double local_58;
  double local_50;
  LandmarkObs local_48;
  
  if (this->num_particles != 0) {
    uVar8 = 0;
    local_78 = this;
    do {
      pPVar1 = (this->particles).super__Vector_base<Particle,_std::allocator<Particle>_>._M_impl.
               super__Vector_impl_data._M_start;
      local_68 = uVar8;
      dVar13 = cos(pPVar1[uVar8].theta);
      local_50 = sin(pPVar1[uVar8].theta);
      local_58 = pPVar1[uVar8].x;
      local_60 = pPVar1[uVar8].y;
      local_98 = (LandmarkObs *)0x0;
      iStack_90._M_current = (LandmarkObs *)0x0;
      local_88 = (LandmarkObs *)0x0;
      pLVar3 = (observations->super__Vector_base<LandmarkObs,_std::allocator<LandmarkObs>_>)._M_impl
               .super__Vector_impl_data._M_start;
      local_70 = pPVar1;
      if ((observations->super__Vector_base<LandmarkObs,_std::allocator<LandmarkObs>_>)._M_impl.
          super__Vector_impl_data._M_finish != pLVar3) {
        uVar5 = 0;
        uVar7 = 1;
        do {
          local_48.x = (pLVar3[uVar5].x * dVar13 + local_58) - pLVar3[uVar5].y * local_50;
          local_48.y = pLVar3[uVar5].y * dVar13 + pLVar3[uVar5].x * local_50 + local_60;
          if (iStack_90._M_current == local_88) {
            std::vector<LandmarkObs,std::allocator<LandmarkObs>>::
            _M_realloc_insert<LandmarkObs_const&>
                      ((vector<LandmarkObs,std::allocator<LandmarkObs>> *)&local_98,iStack_90,
                       &local_48);
          }
          else {
            (iStack_90._M_current)->y = local_48.y;
            (iStack_90._M_current)->id = local_48.id;
            *(undefined4 *)&(iStack_90._M_current)->field_0x4 = local_48._4_4_;
            (iStack_90._M_current)->x = local_48.x;
            iStack_90._M_current = iStack_90._M_current + 1;
          }
          pLVar3 = (observations->super__Vector_base<LandmarkObs,_std::allocator<LandmarkObs>_>).
                   _M_impl.super__Vector_impl_data._M_start;
          uVar5 = ((long)(observations->
                         super__Vector_base<LandmarkObs,_std::allocator<LandmarkObs>_>)._M_impl.
                         super__Vector_impl_data._M_finish - (long)pLVar3 >> 3) *
                  -0x5555555555555555;
          bVar12 = uVar7 <= uVar5;
          lVar6 = uVar5 - uVar7;
          uVar5 = uVar7;
          uVar7 = (ulong)((int)uVar7 + 1);
        } while (bVar12 && lVar6 != 0);
      }
      pPVar1 = local_70;
      local_70[uVar8].weight = 1.0;
      if (iStack_90._M_current != local_98) {
        uVar5 = 0;
        do {
          psVar4 = (map_landmarks->landmark_list).
                   super__Vector_base<Map::single_landmark_s,_std::allocator<Map::single_landmark_s>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          lVar6 = (long)(map_landmarks->landmark_list).
                        super__Vector_base<Map::single_landmark_s,_std::allocator<Map::single_landmark_s>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)psVar4;
          if (lVar6 == 0) {
            psVar9 = (pointer)0x0;
          }
          else {
            uVar7 = (lVar6 >> 2) * -0x5555555555555555;
            uVar10 = 1;
            psVar9 = (pointer)0x0;
            dVar13 = sensor_range * sensor_range;
            do {
              dVar15 = (double)psVar4->x_f - local_98[uVar5].x;
              dVar16 = (double)psVar4->y_f - local_98[uVar5].y;
              dVar15 = dVar15 * dVar15 + dVar16 * dVar16;
              psVar2 = psVar4;
              if (dVar13 <= dVar15) {
                dVar15 = dVar13;
                psVar2 = psVar9;
              }
              psVar9 = psVar2;
              dVar13 = dVar15;
              uVar11 = (ulong)uVar10;
              psVar4 = psVar4 + 1;
              uVar10 = uVar10 + 1;
            } while (uVar11 <= uVar7 && uVar7 - uVar11 != 0);
          }
          if (psVar9 != (pointer)0x0) {
            dVar14 = local_98[uVar5].x - (double)psVar9->x_f;
            dVar16 = local_98[uVar5].y - (double)psVar9->y_f;
            dVar13 = *std_landmark;
            dVar15 = std_landmark[1];
            dVar16 = exp(-((dVar16 * dVar16) / (dVar15 * dVar15 + dVar15 * dVar15) +
                          (dVar14 * dVar14) / (dVar13 * dVar13 + dVar13 * dVar13)));
            pPVar1[uVar8].weight =
                 dVar16 * (1.0 / (dVar13 * 6.283185307179586 * dVar15)) * pPVar1[uVar8].weight;
          }
          uVar5 = (ulong)((int)uVar5 + 1);
          uVar7 = ((long)iStack_90._M_current - (long)local_98 >> 3) * -0x5555555555555555;
        } while (uVar5 <= uVar7 && uVar7 - uVar5 != 0);
      }
      uVar5 = local_68;
      this = local_78;
      (local_78->weights).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start[local_68] = pPVar1[uVar8].weight;
      if (local_98 != (LandmarkObs *)0x0) {
        operator_delete(local_98);
      }
      uVar8 = uVar5 + 1;
    } while (uVar8 < this->num_particles);
  }
  return;
}

Assistant:

void ParticleFilter::updateWeights(const double sensor_range, const double std_landmark[], 
		const std::vector<LandmarkObs>& observations, const Map& map_landmarks) 
{
	// TODO: Update the weights of each particle using a mult-variate Gaussian distribution. You can read
	//   more about this distribution here: https://en.wikipedia.org/wiki/Multivariate_normal_distribution
	// NOTE: The observations are given in the VEHICLE'S coordinate system. Your particles are located
	//   according to the MAP'S coordinate system. You will need to transform between the two systems.
	//   Keep in mind that this transformation requires both rotation AND translation (but no scaling).
	//   The following is a good resource for the theory:
	//   https://www.willamette.edu/~gorr/classes/GeneralGraphics/Transforms/transforms2d.htm
	//   and the following is a good resource for the actual equation to implement (look at equation 
	//   3.33. Note that you'll need to switch the minus sign in that equation to a plus to account 
	//   for the fact that the map's y-axis actually points downwards.)
	//   http://planning.cs.uiuc.edu/node99.html
    const double sensor_range_squared = sensor_range*sensor_range;

    for (unsigned int i = 0; i < num_particles; ++i)
    {
        Particle& cur_particle        = particles[i];
        const double cosThetaParticle = std::cos(cur_particle.theta);
        const double sinThetaParticle = std::sin(cur_particle.theta);
        const double xParticle        = cur_particle.x;
        const double yParticle        = cur_particle.y;

        std::vector<LandmarkObs> meas_map;
        for (unsigned int j = 0; j < observations.size(); ++j)
        {
            const LandmarkObs& cur_meas_veh = observations[j];
            LandmarkObs cur_meas_map;

            //Transform from vehicle to map
            cur_meas_map.x = xParticle  + cur_meas_veh.x*cosThetaParticle - cur_meas_veh.y*sinThetaParticle;
            cur_meas_map.y = yParticle  + cur_meas_veh.x*sinThetaParticle + cur_meas_veh.y*cosThetaParticle;
            meas_map.push_back(cur_meas_map);
        }

        cur_particle.weight = 1.0;

        for(unsigned int j = 0; j < meas_map.size(); ++j)
        {
            const LandmarkObs& cur_mea_map = meas_map[j];
            double min_dist_squared = sensor_range_squared;
            const Map::single_landmark_s* closestLm = NULL;

            for (unsigned int k = 0; k < map_landmarks.landmark_list.size(); ++k) 
            {
                const Map::single_landmark_s& cur_lm = map_landmarks.landmark_list[k];
                const double x_lm = cur_lm.x_f;
                const double y_lm = cur_lm.y_f;

                const double cur_dist_squared = distSquared(cur_mea_map.x, cur_mea_map.y, x_lm, y_lm);
                if(cur_dist_squared < min_dist_squared)
                {
                    min_dist_squared = cur_dist_squared;
                    closestLm = &cur_lm;
                }
            }

            if(closestLm)
            {
                const double x_meas   = cur_mea_map.x;
                const double y_meas   = cur_mea_map.y;
                const double x_mu     = closestLm->x_f;
                const double y_mu     = closestLm->y_f;
                const double measProb = 1/(2.0*PI*std_landmark[0]*std_landmark[1])*std::exp(-(std::pow(x_meas-x_mu,2.0)/(2.0*pow(std_landmark[0],2.0))+pow(y_meas-y_mu,2.0)/(2.0*pow(std_landmark[1],2.0))));
                cur_particle.weight   *= measProb;
            }
        }
        weights[i] = cur_particle.weight;
    }
}